

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Impulse_::volume_unit(Blip_Impulse_ *this,double new_unit)

{
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  imp_t *in_stack_00000010;
  int in_stack_0000001c;
  Blip_Impulse_ *in_stack_00000020;
  blip_eq_t *in_stack_00000678;
  Blip_Impulse_ *in_stack_00000680;
  Blip_Impulse_ *in_stack_00000bf0;
  blip_eq_t local_28;
  double local_10;
  
  if ((in_XMM0_Qa != *(double *)(in_RDI + 0x18)) ||
     (NAN(in_XMM0_Qa) || NAN(*(double *)(in_RDI + 0x18)))) {
    local_10 = in_XMM0_Qa;
    if ((*(byte *)(in_RDI + 0x3c) & 1) != 0) {
      blip_eq_t::blip_eq_t(&local_28,-8.87,0x2260,0xac44);
      treble_eq(in_stack_00000680,in_stack_00000678);
    }
    *(double *)(in_RDI + 0x18) = local_10;
    dVar1 = floor(*(double *)(in_RDI + 0x18) * 65536.0 + 0.5);
    *(uint *)(in_RDI + 0x48) =
         ((uint)(long)dVar1 |
         (uint)(long)(dVar1 - 9.223372036854776e+18) & (uint)((long)dVar1 >> 0x3f)) * 0x10001;
    if (*(int *)(in_RDI + 0x34) == 0) {
      scale_impulse(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
    }
    else {
      fine_volume_unit(in_stack_00000bf0);
    }
  }
  return;
}

Assistant:

void Blip_Impulse_::volume_unit( double new_unit )
{
	if ( new_unit == volume_unit_ )
		return;
	
	if ( generate )
		treble_eq( blip_eq_t( -8.87, 8800, 44100 ) );
	
	volume_unit_ = new_unit;
	
	offset = 0x10001 * (unsigned long) floor( volume_unit_ * 0x10000 + 0.5 );
	
	if ( fine_bits )
		fine_volume_unit();
	else
		scale_impulse( offset & 0xffff, impulses );
}